

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_26UL> *params_2,
          ArrayPtr<const_char> *params_3)

{
  size_t sVar1;
  char *__n;
  long lVar2;
  size_t size;
  char *__dest;
  long local_50 [2];
  char *local_40;
  undefined8 local_38;
  
  local_50[0] = *(long *)(this + 8);
  local_50[1] = params->size_;
  local_40 = params_1->ptr;
  local_38 = *(undefined8 *)params_2->content;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_50 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  heapString(__return_storage_ptr__,size);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(__dest,*(void **)this,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = params->size_;
  if (sVar1 != 0) {
    memcpy(__dest,params->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  __n = params_1->ptr;
  if (__n != (char *)0x0) {
    memcpy(__dest,&params_1->size_,(size_t)__n);
    __dest = __dest + (long)__n;
  }
  if (*(size_t *)params_2->content != 0) {
    memcpy(__dest,(void *)params_2->currentSize,*(size_t *)params_2->content);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}